

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O1

void __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::
MeshEdgebreakerEncoderImpl(MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder> *this)

{
  (this->super_MeshEdgebreakerEncoderImplInterface)._vptr_MeshEdgebreakerEncoderImplInterface =
       (_func_int **)&PTR__MeshEdgebreakerEncoderImpl_001dfb88;
  (this->visited_faces_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
  ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->visited_faces_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
  ._M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->visited_vertex_ids_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->visited_vertex_ids_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  this->encoder_ = (MeshEdgebreakerEncoder *)0x0;
  this->mesh_ = (Mesh *)0x0;
  (this->corner_table_)._M_t.
  super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>._M_t.
  super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
  super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl = (CornerTable *)0x0;
  (this->corner_traversal_stack_).
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->corner_traversal_stack_).
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->corner_traversal_stack_).
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->corner_traversal_stack_).
           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->visited_faces_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 4) = 0;
  (this->visited_faces_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
  ._M_end_of_storage = (_Bit_pointer)0x0;
  (this->pos_encoding_data_).encoded_attribute_value_index_to_corner_map.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pos_encoding_data_).encoded_attribute_value_index_to_corner_map.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pos_encoding_data_).encoded_attribute_value_index_to_corner_map.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pos_encoding_data_).vertex_to_encoded_attribute_value_index_map.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->pos_encoding_data_).vertex_to_encoded_attribute_value_index_map.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->pos_encoding_data_).vertex_to_encoded_attribute_value_index_map.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish +
   4) = 0;
  *(undefined8 *)
   ((long)&(this->pos_encoding_data_).vertex_to_encoded_attribute_value_index_map.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage + 4) = 0;
  (this->processed_connectivity_corners_).
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->processed_connectivity_corners_).
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->processed_connectivity_corners_).
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->visited_vertex_ids_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->visited_vertex_ids_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  (this->visited_vertex_ids_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (this->vertex_traversal_length_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertex_traversal_length_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vertex_traversal_length_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->topology_split_event_data_).
  super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->topology_split_event_data_).
  super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->topology_split_event_data_).
  super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->face_to_split_symbol_map_)._M_h._M_buckets =
       &(this->face_to_split_symbol_map_)._M_h._M_single_bucket;
  (this->face_to_split_symbol_map_)._M_h._M_bucket_count = 1;
  (this->face_to_split_symbol_map_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->face_to_split_symbol_map_)._M_h._M_element_count = 0;
  (this->face_to_split_symbol_map_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->visited_holes_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
  ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->visited_holes_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
  ._M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->face_to_split_symbol_map_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->face_to_split_symbol_map_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)((long)&(this->face_to_split_symbol_map_)._M_h._M_single_bucket + 4) = 0;
  *(undefined8 *)
   ((long)&(this->visited_holes_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 4) = 0;
  (this->vertex_hole_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vertex_hole_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->visited_holes_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
  ._M_end_of_storage = (_Bit_pointer)0x0;
  (this->vertex_hole_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->last_encoded_symbol_id_ = -1;
  *(undefined4 *)
   ((long)&(this->attribute_encoder_to_data_id_map_).super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->attribute_encoder_to_data_id_map_).super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->attribute_encoder_to_data_id_map_).super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->attribute_data_).
           super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->attribute_data_).
           super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)&this->num_split_symbols_ = 0;
  *(undefined8 *)
   ((long)&(this->attribute_data_).
           super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  MeshEdgebreakerTraversalEncoder::MeshEdgebreakerTraversalEncoder(&this->traversal_encoder_);
  this->use_single_connectivity_ = false;
  return;
}

Assistant:

MeshEdgebreakerEncoderImpl<TraversalEncoder>::MeshEdgebreakerEncoderImpl()
    : encoder_(nullptr),
      mesh_(nullptr),
      last_encoded_symbol_id_(-1),
      num_split_symbols_(0),
      use_single_connectivity_(false) {}